

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O2

void WebRtcIsac_InitMasking(MaskFiltstr *maskdata)

{
  long lVar1;
  
  for (lVar1 = -0x800; lVar1 != 0; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)maskdata->DataBufferHi + lVar1) = 0;
    *(undefined8 *)((long)maskdata->CorrBufLo + lVar1) = 0;
  }
  for (lVar1 = -0x34; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined8 *)((long)maskdata->CorrBufHi + lVar1 * 2) = 0;
    *(undefined4 *)((long)maskdata->PreStateLoG + lVar1) = 0;
    *(undefined4 *)((long)maskdata->PreStateHiF + lVar1) = 0;
    *(undefined4 *)((long)maskdata->PostStateLoG + lVar1) = 0;
    *(undefined4 *)((long)maskdata->PostStateHiF + lVar1) = 0;
  }
  for (lVar1 = -0x1c; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined8 *)((long)maskdata->PreStateLoF + lVar1 * 2) = 0;
    *(undefined4 *)((long)maskdata->PreStateHiG + lVar1) = 0;
    *(undefined4 *)((long)maskdata->PostStateLoF + lVar1) = 0;
    *(undefined4 *)((long)maskdata->PostStateHiG + lVar1) = 0;
    *(undefined4 *)((long)maskdata->PostStateHiG + lVar1 + 0x1c) = 0;
  }
  maskdata->OldEnergy = 10.0;
  return;
}

Assistant:

void WebRtcIsac_InitMasking(MaskFiltstr *maskdata) {

  int k;

  for (k = 0; k < WINLEN; k++) {
    maskdata->DataBufferLo[k] = 0.0;
    maskdata->DataBufferHi[k] = 0.0;
  }
  for (k = 0; k < ORDERLO+1; k++) {
    maskdata->CorrBufLo[k] = 0.0;
    maskdata->PreStateLoF[k] = 0.0;
    maskdata->PreStateLoG[k] = 0.0;
    maskdata->PostStateLoF[k] = 0.0;
    maskdata->PostStateLoG[k] = 0.0;
  }
  for (k = 0; k < ORDERHI+1; k++) {
    maskdata->CorrBufHi[k] = 0.0;
    maskdata->PreStateHiF[k] = 0.0;
    maskdata->PreStateHiG[k] = 0.0;
    maskdata->PostStateHiF[k] = 0.0;
    maskdata->PostStateHiG[k] = 0.0;
  }

  maskdata->OldEnergy = 10.0;
  return;
}